

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::Instruction::operator=(Instruction *this,Instruction *that)

{
  Instruction *that_local;
  Instruction *this_local;
  
  this->context_ = that->context_;
  this->opcode_ = that->opcode_;
  this->has_type_id_ = (bool)(that->has_type_id_ & 1);
  this->has_result_id_ = (bool)(that->has_result_id_ & 1);
  this->unique_id_ = that->unique_id_;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::operator=
            (&this->operands_,&that->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::operator=
            (&this->dbg_line_insts_,&that->dbg_line_insts_);
  this->dbg_scope_ = that->dbg_scope_;
  return this;
}

Assistant:

Instruction& Instruction::operator=(Instruction&& that) {
  context_ = that.context_;
  opcode_ = that.opcode_;
  has_type_id_ = that.has_type_id_;
  has_result_id_ = that.has_result_id_;
  unique_id_ = that.unique_id_;
  operands_ = std::move(that.operands_);
  dbg_line_insts_ = std::move(that.dbg_line_insts_);
  dbg_scope_ = that.dbg_scope_;
  return *this;
}